

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# init.cpp
# Opt level: O0

path * GetPidFile(ArgsManager *args)

{
  string *in_RSI;
  ArgsManager *in_RDI;
  long in_FS_OFFSET;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff28;
  undefined1 net_specific;
  string *path;
  ArgsManager *args_00;
  allocator<char> *in_stack_ffffffffffffff68;
  string *arg;
  ArgsManager *this;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  args_00 = (ArgsManager *)&stack0xffffffffffffff87;
  path = in_RSI;
  arg = in_RSI;
  this = in_RDI;
  std::allocator<char>::allocator();
  net_specific = (undefined1)((ulong)in_RSI >> 0x38);
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this,(char *)arg,
             in_stack_ffffffffffffff68);
  fs::path::path((path *)0xfc27d9,(char *)in_stack_ffffffffffffff28);
  ArgsManager::GetPathArg(this,arg,(path *)in_stack_ffffffffffffff68);
  AbsPathForConfigVal(args_00,(path *)path,(bool)net_specific);
  fs::path::~path((path *)in_stack_ffffffffffffff28);
  fs::path::~path((path *)in_stack_ffffffffffffff28);
  std::__cxx11::string::~string(in_stack_ffffffffffffff28);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff87);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (path *)in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

static fs::path GetPidFile(const ArgsManager& args)
{
    return AbsPathForConfigVal(args, args.GetPathArg("-pid", BITCOIN_PID_FILENAME));
}